

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

arena_t * duckdb_je_arena_choose_hard(tsd_t *tsd,_Bool internal)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  arena_t *paVar4;
  uint ind;
  ulong uVar5;
  atomic_p_t aVar6;
  _Bool is_new_arena [2];
  uint choose [2];
  
  ind = duckdb_je_narenas_auto;
  if (duckdb_je_narenas_auto < 2) {
    aVar6.repr = duckdb_je_arenas[0].repr;
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      aVar6.repr = (arena_t *)0x0;
    }
    arena_bind(tsd,0,false);
    arena_bind(tsd,0,true);
  }
  else {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      choose[lVar3] = 0;
      is_new_arena[lVar3] = false;
    }
    malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_arenas_lock);
    for (uVar5 = 1; uVar5 < duckdb_je_narenas_auto; uVar5 = uVar5 + 1) {
      if (duckdb_je_arenas[uVar5].repr == (void *)0x0) {
        if (ind == duckdb_je_narenas_auto) {
          ind = (uint)uVar5;
        }
      }
      else {
        for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
          paVar4 = (arena_t *)duckdb_je_arenas[uVar5].repr;
          if (paVar4 == (arena_t *)0x0) {
            paVar4 = (arena_t *)0x0;
          }
          uVar1 = duckdb_je_arena_nthreads_get(paVar4,lVar3 != 0);
          paVar4 = (arena_t *)duckdb_je_arenas[choose[lVar3]].repr;
          if (paVar4 == (arena_t *)0x0) {
            paVar4 = (arena_t *)0x0;
          }
          uVar2 = duckdb_je_arena_nthreads_get(paVar4,lVar3 != 0);
          if (uVar1 < uVar2) {
            choose[lVar3] = (uint)uVar5;
          }
        }
      }
    }
    aVar6.repr = (arena_t *)0x0;
    for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
      paVar4 = (arena_t *)duckdb_je_arenas[choose[uVar5]].repr;
      if (paVar4 == (arena_t *)0x0) {
        paVar4 = (arena_t *)0x0;
      }
      uVar1 = duckdb_je_arena_nthreads_get(paVar4,uVar5 != 0);
      if ((uVar1 == 0) || (ind == duckdb_je_narenas_auto)) {
        if ((internal == uVar5) &&
           (aVar6.repr = (arena_t *)duckdb_je_arenas[choose[uVar5]].repr,
           (arena_t *)duckdb_je_arenas[choose[uVar5]].repr == (arena_t *)0x0)) {
          aVar6.repr = (arena_t *)0x0;
        }
      }
      else {
        choose[uVar5] = ind;
        paVar4 = arena_init_locked((tsdn_t *)tsd,ind,&duckdb_je_arena_config_default);
        if (paVar4 == (arena_t *)0x0) {
          duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
          return (arena_t *)0x0;
        }
        is_new_arena[uVar5] = true;
        if (internal == uVar5) {
          aVar6.repr = paVar4;
        }
      }
      arena_bind(tsd,choose[uVar5],uVar5 != 0);
    }
    duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      if (is_new_arena[lVar3] == true) {
        arena_new_create_background_thread((tsdn_t *)tsd,choose[lVar3]);
      }
    }
  }
  return (arena_t *)aVar6.repr;
}

Assistant:

arena_t *
arena_choose_hard(tsd_t *tsd, bool internal) {
	arena_t *ret JEMALLOC_CC_SILENCE_INIT(NULL);

	if (have_percpu_arena && PERCPU_ARENA_ENABLED(opt_percpu_arena)) {
		unsigned choose = percpu_arena_choose();
		ret = arena_get(tsd_tsdn(tsd), choose, true);
		assert(ret != NULL);
		arena_bind(tsd, arena_ind_get(ret), false);
		arena_bind(tsd, arena_ind_get(ret), true);

		return ret;
	}

	if (narenas_auto > 1) {
		unsigned i, j, choose[2], first_null;
		bool is_new_arena[2];

		/*
		 * Determine binding for both non-internal and internal
		 * allocation.
		 *
		 *   choose[0]: For application allocation.
		 *   choose[1]: For internal metadata allocation.
		 */

		for (j = 0; j < 2; j++) {
			choose[j] = 0;
			is_new_arena[j] = false;
		}

		first_null = narenas_auto;
		malloc_mutex_lock(tsd_tsdn(tsd), &arenas_lock);
		assert(arena_get(tsd_tsdn(tsd), 0, false) != NULL);
		for (i = 1; i < narenas_auto; i++) {
			if (arena_get(tsd_tsdn(tsd), i, false) != NULL) {
				/*
				 * Choose the first arena that has the lowest
				 * number of threads assigned to it.
				 */
				for (j = 0; j < 2; j++) {
					if (arena_nthreads_get(arena_get(
					    tsd_tsdn(tsd), i, false), !!j) <
					    arena_nthreads_get(arena_get(
					    tsd_tsdn(tsd), choose[j], false),
					    !!j)) {
						choose[j] = i;
					}
				}
			} else if (first_null == narenas_auto) {
				/*
				 * Record the index of the first uninitialized
				 * arena, in case all extant arenas are in use.
				 *
				 * NB: It is possible for there to be
				 * discontinuities in terms of initialized
				 * versus uninitialized arenas, due to the
				 * "thread.arena" mallctl.
				 */
				first_null = i;
			}
		}

		for (j = 0; j < 2; j++) {
			if (arena_nthreads_get(arena_get(tsd_tsdn(tsd),
			    choose[j], false), !!j) == 0 || first_null ==
			    narenas_auto) {
				/*
				 * Use an unloaded arena, or the least loaded
				 * arena if all arenas are already initialized.
				 */
				if (!!j == internal) {
					ret = arena_get(tsd_tsdn(tsd),
					    choose[j], false);
				}
			} else {
				arena_t *arena;

				/* Initialize a new arena. */
				choose[j] = first_null;
				arena = arena_init_locked(tsd_tsdn(tsd),
				    choose[j], &arena_config_default);
				if (arena == NULL) {
					malloc_mutex_unlock(tsd_tsdn(tsd),
					    &arenas_lock);
					return NULL;
				}
				is_new_arena[j] = true;
				if (!!j == internal) {
					ret = arena;
				}
			}
			arena_bind(tsd, choose[j], !!j);
		}
		malloc_mutex_unlock(tsd_tsdn(tsd), &arenas_lock);

		for (j = 0; j < 2; j++) {
			if (is_new_arena[j]) {
				assert(choose[j] > 0);
				arena_new_create_background_thread(
				    tsd_tsdn(tsd), choose[j]);
			}
		}

	} else {
		ret = arena_get(tsd_tsdn(tsd), 0, false);
		arena_bind(tsd, 0, false);
		arena_bind(tsd, 0, true);
	}

	return ret;
}